

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<UnsatisfiedJump,_false,_false>::grow_no_destroy
          (FastVector<UnsatisfiedJump,_false,_false> *this,uint newSize)

{
  UnsatisfiedJump *dst;
  UnsatisfiedJump *newData;
  uint newSize_local;
  FastVector<UnsatisfiedJump,_false,_false> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 0x20;
  }
  dst = NULLC::construct<UnsatisfiedJump>(newData._4_4_);
  if (dst != (UnsatisfiedJump *)0x0) {
    if (this->data != (UnsatisfiedJump *)0x0) {
      NULLC::copyMemory(dst,this->data,(ulong)this->max << 4);
    }
    this->data = dst;
    this->max = newData._4_4_;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<UnsatisfiedJump>::grow_no_destroy(unsigned int) [T = UnsatisfiedJump, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}